

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong __n;
  ma_uint8 temp [4096];
  undefined8 local_1038;
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (ma_dr_wav *)0x0)) {
    uVar12 = 0;
  }
  else {
    uVar3 = pWav->channels;
    uVar4 = pWav->bitsPerSample;
    if ((uVar4 & 7) == 0) {
      uVar8 = (uint)(pWav->fmt).channels * (uint)uVar4 >> 3;
    }
    else {
      uVar8 = (uint)(pWav->fmt).blockAlign;
    }
    if (((pWav->translatedFormatTag & 0xfffe) != 6) || (uVar13 = 0, uVar8 == (pWav->fmt).channels))
    {
      uVar13 = (ulong)uVar8;
    }
    uVar12 = 0;
    uVar7 = uVar13 / uVar3;
    if ((uint)uVar3 <= (uint)uVar13) {
      uVar13 = (ulong)uVar4 * uVar3 * framesToWrite >> 3;
      lVar14 = 0;
      uVar8 = (uint)uVar7;
      do {
        if (uVar13 == 0) break;
        uVar12 = 0x1000 / uVar7;
        __n = uVar12 * uVar7;
        if (uVar13 < uVar12 * uVar7) {
          __n = uVar13;
        }
        memcpy(&local_1038,pData,__n);
        switch(uVar8) {
        case 2:
          if (uVar8 < 0x1001) {
            uVar10 = 0;
            do {
              puVar1 = (ushort *)((long)&local_1038 + uVar10 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar12);
          }
          break;
        case 3:
          if (uVar8 < 0x1001) {
            puVar9 = (undefined1 *)((long)&local_1038 + 2);
            uVar10 = 0;
            do {
              uVar2 = puVar9[-2];
              puVar9[-2] = *puVar9;
              *puVar9 = uVar2;
              uVar10 = uVar10 + 1;
              puVar9 = puVar9 + 3;
            } while (uVar10 < uVar12);
          }
          break;
        case 4:
          if (uVar8 < 0x1001) {
            uVar10 = 0;
            do {
              uVar5 = *(uint *)((long)&local_1038 + uVar10 * 4);
              *(uint *)((long)&local_1038 + uVar10 * 4) =
                   uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar12);
          }
          break;
        case 8:
          if (uVar8 < 0x1001) {
            uVar10 = 0;
            do {
              uVar6 = (&local_1038)[uVar10];
              (&local_1038)[uVar10] =
                   uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                   | uVar6 << 0x38;
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar12);
          }
        }
        if (uVar8 < 0x1001) {
          sVar11 = (*pWav->onWrite)(pWav->pUserData,&local_1038,__n);
          pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar11;
        }
        else {
          sVar11 = 0;
        }
        uVar13 = uVar13 - sVar11;
        lVar14 = lVar14 + sVar11;
        pData = (void *)((long)pData + sVar11);
      } while (sVar11 != 0);
      uVar12 = ((ulong)(lVar14 << 3) / (ulong)pWav->bitsPerSample) / (ulong)pWav->channels;
    }
  }
  return uVar12;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    ma_uint32 bytesPerSample;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    bytesPerSample = ma_dr_wav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    if (bytesPerSample == 0) {
        return 0;
    }
    while (bytesToWrite > 0) {
        ma_uint8 temp[4096];
        ma_uint32 sampleCount;
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        sampleCount = sizeof(temp)/bytesPerSample;
        if (bytesToWriteThisIteration > ((ma_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((ma_uint64)sampleCount)*bytesPerSample;
        }
        MA_DR_WAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        ma_dr_wav__bswap_samples(temp, sampleCount, bytesPerSample);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}